

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_flat_file.c
# Opt level: O1

planck_unit_suite_t * flat_file_getsuite(void)

{
  planck_unit_suite_t *suite;
  
  suite = planck_unit_new_suite();
  planck_unit_add_to_suite
            (suite,test_flat_file_create_destroy,"test_flat_file_create_destroy",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_insert_single,"test_flat_file_insert_single",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_insert_many,"test_flat_file_insert_many",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_scan_cases_small_buf,"test_flat_file_scan_cases_small_buf",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_scan_cases_large_buf,"test_flat_file_scan_cases_large_buf",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_delete_edge_case,"test_flat_file_delete_edge_case",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_insert_bad_sort,"test_flat_file_insert_bad_sort",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_insert_good_sort,"test_flat_file_insert_good_sort",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_binary_search_cases,"test_flat_file_sort_binary_search_cases"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_get_empty,"test_flat_file_sort_get_empty",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_get_single_nonexist,"test_flat_file_sort_get_single_nonexist"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_get_single_exist,"test_flat_file_sort_get_single_exist",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_get_many_nonexist,"test_flat_file_sort_get_many_nonexist",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_get_many_exist,"test_flat_file_sort_get_many_exist",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_get_many_exist_duplicates,
             "test_flat_file_sort_get_many_exist_duplicates",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_update_empty,"test_flat_file_sort_update_empty",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_update_single_nonexist,
             "test_flat_file_sort_update_single_nonexist",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_update_single_exist,"test_flat_file_sort_update_single_exist"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_update_many_nonexist,
             "test_flat_file_sort_update_many_nonexist",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_update_many_exist,"test_flat_file_sort_update_many_exist",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  planck_unit_add_to_suite
            (suite,test_flat_file_sort_update_many_exist_duplicates,
             "test_flat_file_sort_update_many_exist_duplicates",
             "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/dictionary/flat_file/test_flat_file.c"
            );
  return suite;
}

Assistant:

planck_unit_suite_t *
flat_file_getsuite(
) {
	planck_unit_suite_t *suite = planck_unit_new_suite();

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_create_destroy);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_insert_single);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_insert_many);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_scan_cases_small_buf);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_scan_cases_large_buf);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_delete_edge_case);

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_insert_bad_sort);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_insert_good_sort);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_binary_search_cases);

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_get_empty);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_get_single_nonexist);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_get_single_exist);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_get_many_nonexist);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_get_many_exist);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_get_many_exist_duplicates);

	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_update_empty);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_update_single_nonexist);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_update_single_exist);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_update_many_nonexist);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_update_many_exist);
	PLANCK_UNIT_ADD_TO_SUITE(suite, test_flat_file_sort_update_many_exist_duplicates);

	return suite;
}